

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O0

void __thiscall dynet::SparseInputNode::~SparseInputNode(SparseInputNode *this)

{
  undefined8 *in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  
  *in_RDI = &PTR__SparseInputNode_01048dd0;
  std::vector<float,_std::allocator<float>_>::~vector(unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)unaff_retaddr);
  Node::~Node((Node *)0xd56aa8);
  return;
}

Assistant:

explicit SparseInputNode(const Dim& d, const std::vector<unsigned int>& id,
                           const std::vector<float>& dat, float defdat = 0.f)
      : dim(d), ids(id), data(dat), defdata(defdat) {}